

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O0

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  time_t time;
  _Storage<int,_true> a_Stack_e8 [2];
  tm tm;
  _Optional_payload_base<int> local_a8;
  _Optional_payload_base<int> local_a0;
  optional<int> usec;
  _Optional_payload_base<int> local_8c;
  optional<int> msec;
  int sec;
  int min;
  int hour;
  anon_class_8_1_50ba0494 parseFragment;
  StreamCursor local_60;
  StreamCursor cursor;
  RawStreamBuf<char> buf;
  size_t size_local;
  char *offset_local;
  
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)&cursor,offset,size);
  StreamCursor::StreamCursor(&local_60,(StreamBuf<char> *)&cursor,0);
  _min = &local_60;
  uVar2 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&min,2,"Could not parse hours from UTCTimeOnly");
  bVar1 = StreamCursor::advance(&local_60,1);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"Could not parse minutes from UTCTimeOnly, expected \':\' got EOF");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       cast::anon_class_8_1_50ba0494::operator()
                 ((anon_class_8_1_50ba0494 *)&min,2,"Could not parse minutes from UTCTimeOnly");
  bVar1 = StreamCursor::advance(&local_60,1);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"Could not parse seconds from UTCTimeOnly, expected \':\' got EOF");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload
  ._M_value = cast::anon_class_8_1_50ba0494::operator()
                        ((anon_class_8_1_50ba0494 *)&min,2,
                         "Could not parse seconds from UTCTimeOnly");
  std::optional<int>::optional((optional<int> *)&local_8c);
  bVar1 = StreamCursor::eof(&local_60);
  if (!bVar1) {
    StreamCursor::advance(&local_60,1);
    usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value =
         cast::anon_class_8_1_50ba0494::operator()
                   ((anon_class_8_1_50ba0494 *)&min,3,
                    "Could not parse milliseconds from UTCTimeOnly");
    std::optional<int>::optional<int,_true>
              ((optional<int> *)
               &usec.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged,(int *)&usec);
    local_8c = stack0xffffffffffffff6c;
  }
  std::optional<int>::optional((optional<int> *)&local_a0);
  bVar1 = StreamCursor::eof(&local_60);
  if (!bVar1) {
    tm.tm_zone._4_4_ =
         cast::anon_class_8_1_50ba0494::operator()
                   ((anon_class_8_1_50ba0494 *)&min,3,
                    "Could not parse microseconds from UTCTimeOnly");
    std::optional<int>::optional<int,_true>
              ((optional<int> *)&local_a8,(int *)((long)&tm.tm_zone + 4));
    local_a0 = local_a8;
  }
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  tm.tm_gmtoff = 0;
  tm.tm_min = 0;
  tm.tm_sec = uVar2;
  a_Stack_e8[1] =
       (_Storage<int,_true>)
       msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
  ;
  a_Stack_e8[0]._M_value =
       msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload._M_value;
  time = mkgmtime((tm *)a_Stack_e8);
  Type::UTCTimeOnly::Time::Time
            (__return_storage_ptr__,time,(optional<int>)local_8c,(optional<int>)local_a0);
  RawStreamBuf<char>::~RawStreamBuf((RawStreamBuf<char> *)&cursor);
  return __return_storage_ptr__;
}

Assistant:

static Type::UTCTimeOnly::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int hour = parseFragment(2, "Could not parse hours from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimeOnly, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimeOnly, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimeOnly");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimeOnly");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }